

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.cc
# Opt level: O0

CKMSQuantiles * __thiscall
prometheus::detail::TimeWindowQuantiles::rotate(TimeWindowQuantiles *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  type delta;
  TimeWindowQuantiles *this_local;
  
  delta.__r = (rep)this;
  local_20.__d.__r = (duration)::std::chrono::_V2::steady_clock::now();
  local_18.__r = (rep)::std::chrono::operator-(&local_20,&this->last_rotation_);
  while( true ) {
    bVar1 = ::std::chrono::operator>(&local_18,&this->rotation_interval_);
    if (!bVar1) break;
    pvVar4 = ::std::
             vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
             ::operator[](&this->ckms_quantiles_,this->current_bucket_);
    CKMSQuantiles::reset(pvVar4);
    uVar2 = this->current_bucket_ + 1;
    this->current_bucket_ = uVar2;
    sVar3 = ::std::
            vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
            ::size(&this->ckms_quantiles_);
    if (sVar3 <= uVar2) {
      this->current_bucket_ = 0;
    }
    ::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              (&local_18,&this->rotation_interval_);
    ::std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::operator+=(&this->last_rotation_,&this->rotation_interval_);
  }
  pvVar4 = ::std::
           vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
           ::operator[](&this->ckms_quantiles_,this->current_bucket_);
  return pvVar4;
}

Assistant:

CKMSQuantiles& TimeWindowQuantiles::rotate() const {
  auto delta = Clock::now() - last_rotation_;
  while (delta > rotation_interval_) {
    ckms_quantiles_[current_bucket_].reset();

    if (++current_bucket_ >= ckms_quantiles_.size()) {
      current_bucket_ = 0;
    }

    delta -= rotation_interval_;
    last_rotation_ += rotation_interval_;
  }
  return ckms_quantiles_[current_bucket_];
}